

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::Cord::PrependArray(Cord *this,string_view src,MethodIdentifier method)

{
  size_t __n;
  Nullable<const_char_*> __src;
  Nullable<CordRep_*> tree;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t alloc_hint;
  size_t length;
  InlineData data;
  anon_union_16_2_39e9c77e_for_Rep_0 local_48;
  
  length = src._M_len;
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  if (length == 0) {
    return;
  }
  alloc_hint = extraout_RDX;
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __n = cord_internal::InlineData::Rep::inline_size((Rep *)this);
    alloc_hint = extraout_RDX_00;
    if (__n + length < 0x10) {
      local_48.as_tree.cordz_info = 0;
      local_48.as_tree.rep = (CordRep *)0x0;
      cord_internal::InlineData::Rep::set_inline_size((Rep *)&local_48.as_tree,__n + length);
      memcpy(local_48.data + 1,src._M_str,length);
      __src = InlineRep::data(&this->contents_);
      memcpy((void *)((long)&local_48 + length + 1),__src,__n);
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = local_48.as_tree.cordz_info;
      (this->contents_).data_.rep_.field_0.as_tree.rep = local_48.as_tree.rep;
      return;
    }
  }
  tree = NewTree(src._M_str,length,alloc_hint);
  InlineRep::PrependTree(&this->contents_,tree,method);
  return;
}

Assistant:

void Cord::PrependArray(absl::string_view src, MethodIdentifier method) {
  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;  // memcpy(_, nullptr, 0) is undefined.

  if (!contents_.is_tree()) {
    size_t cur_size = contents_.inline_size();
    if (cur_size + src.size() <= InlineRep::kMaxInline) {
      // Use embedded storage.
      InlineData data;
      data.set_inline_size(cur_size + src.size());
      memcpy(data.as_chars(), src.data(), src.size());
      memcpy(data.as_chars() + src.size(), contents_.data(), cur_size);
      contents_.data_ = data;
      return;
    }
  }
  CordRep* rep = NewTree(src.data(), src.size(), 0);
  contents_.PrependTree(rep, method);
}